

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  bool bVar3;
  SQObjectPtr *pSVar4;
  SQRESULT SVar5;
  int faketojump;
  SQObjectPtr val;
  SQObjectPtr realkey;
  SQObjectPtr o;
  
  if (idx < 0) {
    pSVar4 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar4 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar2 = (pSVar4->super_SQObject)._type;
  o.super_SQObject._unVal = (SQObjectValue)(pSVar4->super_SQObject)._unVal.pTable;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &((o.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  o.super_SQObject._type = SVar2;
  pSVar4 = SQVM::GetUp(v,-1);
  realkey.super_SQObject._type = OT_NULL;
  realkey.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (SVar2 == OT_GENERATOR) {
    SVar5 = -1;
    sq_throwerror(v,"cannot iterate a generator");
  }
  else {
    bVar3 = SQVM::FOREACH_OP(v,&o,&realkey,&val,pSVar4,0,0x29a,&faketojump);
    SVar5 = -1;
    if (bVar3 && faketojump != 0x29a) {
      SQVM::Push(v,&realkey);
      SQVM::Push(v,&val);
      SVar5 = 0;
    }
  }
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&realkey);
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar5;
}

Assistant:

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr o=stack_get(v,idx),&refpos = stack_get(v,-1),realkey,val;
    if(type(o) == OT_GENERATOR) {
        return sq_throwerror(v,_SC("cannot iterate a generator"));
    }
    int faketojump;
    if(!v->FOREACH_OP(o,realkey,val,refpos,0,666,faketojump))
        return SQ_ERROR;
    if(faketojump != 666) {
        v->Push(realkey);
        v->Push(val);
        return SQ_OK;
    }
    return SQ_ERROR;
}